

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::impl::get_displacements<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *counts)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  iterator begin;
  int local_20;
  int tmp;
  int sum;
  vector<int,_std::allocator<int>_> *counts_local;
  vector<int,_std::allocator<int>_> *result;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,counts);
  local_20 = 0;
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__)
  ;
  while( true ) {
    local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__)
    ;
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    begin._M_current._4_4_ = local_20;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_30);
    iVar1 = *piVar4;
    iVar3 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar3 <= (ulong)((long)local_20 + (long)iVar1)) {
      assert_fail("(std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
                  ,0x3a,"get_displacements");
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_30);
    iVar1 = begin._M_current._4_4_;
    local_20 = *piVar4 + local_20;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_30);
    *piVar4 = iVar1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> get_displacements(const std::vector<index_t>& counts)
{
    // copy and do an exclusive prefix sum
    std::vector<index_t> result(counts);
    // set the total sum to zero
    index_t sum = 0;
    index_t tmp;

    // calculate the exclusive prefix sum
    typename std::vector<index_t>::iterator begin = result.begin();
    while (begin != result.end())
    {
        tmp = sum;
        // assert that the sum will still fit into the index type (MPI default:
        // int)
        MXX_ASSERT((std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max());
        sum += *begin;
        *begin = tmp;
        ++begin;
    }
    return result;
}